

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

void __thiscall ExampleAppConsole::ExecCommand(ExampleAppConsole *this,char *command_line)

{
  uint uVar1;
  char **__src;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char **ppcVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  AddLog(this,"# %s\n",command_line);
  this->HistoryPos = -1;
  uVar7 = (ulong)(uint)(this->History).Size;
  lVar9 = uVar7 + 1;
  do {
    lVar8 = lVar9;
    iVar3 = (int)uVar7;
    if (iVar3 < 1) goto LAB_001609fc;
    if ((this->History).Size < iVar3) goto LAB_00160b9a;
    iVar2 = Stricmp((this->History).Data[lVar8 + -2],command_line);
    lVar9 = lVar8 + -1;
    uVar7 = (ulong)(iVar3 - 1);
  } while (iVar2 != 0);
  if ((this->History).Size < (int)lVar9) {
LAB_00160b9a:
    __assert_fail("i >= 0 && i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.h"
                  ,0x703,"T &ImVector<char *>::operator[](int) [T = char *]");
  }
  free((this->History).Data[lVar8 + -2]);
  uVar1 = (this->History).Size;
  if ((int)uVar1 < (int)lVar9) {
    __assert_fail("it >= Data && it < Data + Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.h"
                  ,0x71b,"T *ImVector<char *>::erase(const T *) [T = char *]");
  }
  ppcVar5 = (this->History).Data;
  memmove(ppcVar5 + lVar8 + -2,ppcVar5 + lVar9,((ulong)uVar1 - lVar9) * 8);
  (this->History).Size = (this->History).Size + -1;
LAB_001609fc:
  pcVar4 = Strdup(command_line);
  iVar3 = (this->History).Size;
  if (iVar3 == (this->History).Capacity) {
    if (iVar3 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar3 / 2 + iVar3;
    }
    iVar6 = iVar3 + 1;
    if (iVar3 + 1 < iVar2) {
      iVar6 = iVar2;
    }
    ppcVar5 = (char **)ImGui::MemAlloc((long)iVar6 << 3);
    __src = (this->History).Data;
    if (__src != (char **)0x0) {
      memcpy(ppcVar5,__src,(long)(this->History).Size << 3);
      ImGui::MemFree((this->History).Data);
    }
    (this->History).Data = ppcVar5;
    (this->History).Capacity = iVar6;
    iVar3 = (this->History).Size;
  }
  else {
    ppcVar5 = (this->History).Data;
  }
  ppcVar5[iVar3] = pcVar4;
  (this->History).Size = (this->History).Size + 1;
  iVar3 = Stricmp(command_line,"CLEAR");
  if (iVar3 == 0) {
    ClearLog(this);
  }
  else {
    iVar3 = Stricmp(command_line,"HELP");
    if (iVar3 == 0) {
      AddLog(this,"Commands:");
      if (0 < (this->Commands).Size) {
        lVar9 = 0;
        do {
          AddLog(this,"- %s",(this->Commands).Data[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 < (this->Commands).Size);
      }
    }
    else {
      iVar3 = Stricmp(command_line,"HISTORY");
      if (iVar3 == 0) {
        iVar3 = (this->History).Size;
        iVar2 = 10;
        if (10 < iVar3) {
          iVar2 = iVar3;
        }
        if ((int)(iVar2 - 10U) < iVar3) {
          uVar7 = (ulong)(iVar2 - 10U);
          do {
            AddLog(this,"%3d: %s\n",uVar7 & 0xffffffff,(this->History).Data[uVar7]);
            uVar7 = uVar7 + 1;
          } while ((int)uVar7 < (this->History).Size);
        }
      }
      else {
        AddLog(this,"Unknown command: \'%s\'\n",command_line);
      }
    }
  }
  this->ScrollToBottom = true;
  return;
}

Assistant:

void    ExecCommand(const char* command_line)
    {
        AddLog("# %s\n", command_line);

        // Insert into history. First find match and delete it so it can be pushed to the back.
        // This isn't trying to be smart or optimal.
        HistoryPos = -1;
        for (int i = History.Size - 1; i >= 0; i--)
            if (Stricmp(History[i], command_line) == 0)
            {
                free(History[i]);
                History.erase(History.begin() + i);
                break;
            }
        History.push_back(Strdup(command_line));

        // Process command
        if (Stricmp(command_line, "CLEAR") == 0)
        {
            ClearLog();
        }
        else if (Stricmp(command_line, "HELP") == 0)
        {
            AddLog("Commands:");
            for (int i = 0; i < Commands.Size; i++)
                AddLog("- %s", Commands[i]);
        }
        else if (Stricmp(command_line, "HISTORY") == 0)
        {
            int first = History.Size - 10;
            for (int i = first > 0 ? first : 0; i < History.Size; i++)
                AddLog("%3d: %s\n", i, History[i]);
        }
        else
        {
            AddLog("Unknown command: '%s'\n", command_line);
        }

        // On command input, we scroll to bottom even if AutoScroll==false
        ScrollToBottom = true;
    }